

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::sessionT11Fixture::createSession
          (sessionT11Fixture *this,int heartBtInt,int startDay,int endDay)

{
  string *psVar1;
  string *senderCompID;
  string *targetCompID;
  BeginString *beginString;
  Session *pSVar2;
  allocator<char> local_af9;
  STRING local_af8;
  BeginString local_ad8;
  StringField local_a78;
  allocator<char> local_a11;
  string local_a10;
  allocator<char> local_9e9;
  STRING local_9e8;
  ApplVerID local_9c8;
  allocator<char> local_961;
  string local_960;
  allocator<char> local_939;
  STRING local_938;
  ApplVerID local_918;
  allocator<char> local_8b1;
  string local_8b0;
  allocator<char> local_889;
  STRING local_888;
  ApplVerID local_868;
  allocator<char> local_801;
  string local_800;
  undefined1 local_7e0 [8];
  DataDictionaryProvider provider;
  TimeRange sessionTime;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  STRING local_328;
  StringField local_308;
  allocator<char> local_2a1;
  STRING local_2a0;
  StringField local_280;
  allocator<char> local_209;
  STRING local_208;
  StringField local_1e8;
  undefined1 local_188 [8];
  SessionID sessionID;
  int endDay_local;
  int startDay_local;
  int heartBtInt_local;
  sessionT11Fixture *this_local;
  
  sessionID.m_frozenString.field_2._12_4_ = endDay;
  if ((this->object != (Session *)0x0) && (this->object != (Session *)0x0)) {
    (**(code **)(*(long *)this->object + 8))();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"FIXT.1.1",&local_209);
  FIX::BeginString::BeginString((BeginString *)&local_1e8,&local_208);
  psVar1 = FIX::StringField::operator_cast_to_string_(&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"TW",&local_2a1);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_280,&local_2a0);
  senderCompID = FIX::StringField::operator_cast_to_string_(&local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"ISLD",&local_329);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_308,&local_328);
  targetCompID = FIX::StringField::operator_cast_to_string_(&local_308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"",&local_351);
  FIX::SessionID::SessionID((SessionID *)local_188,psVar1,senderCompID,targetCompID,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  FIX::BeginString::~BeginString((BeginString *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  FIX::TimeRange::TimeRange
            ((TimeRange *)&provider.field_0x440,&(this->super_TestCallback).startTime,
             &(this->super_TestCallback).endTime,startDay,sessionID.m_frozenString.field_2._12_4_);
  FIX::DataDictionaryProvider::DataDictionaryProvider((DataDictionaryProvider *)local_7e0);
  beginString = FIX::SessionID::getBeginString((SessionID *)local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_800,"../spec/FIXT11.xml",&local_801);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            ((DataDictionaryProvider *)local_7e0,beginString,&local_800);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator(&local_801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_888,"7",&local_889);
  FIX::ApplVerID::ApplVerID(&local_868,&local_888);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b0,"../spec/FIX50.xml",&local_8b1);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            ((DataDictionaryProvider *)local_7e0,&local_868,&local_8b0);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::allocator<char>::~allocator(&local_8b1);
  FIX::ApplVerID::~ApplVerID(&local_868);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator(&local_889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"4",&local_939);
  FIX::ApplVerID::ApplVerID(&local_918,&local_938);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_960,"../spec/FIX42.xml",&local_961);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            ((DataDictionaryProvider *)local_7e0,&local_918,&local_960);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator(&local_961);
  FIX::ApplVerID::~ApplVerID(&local_918);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator(&local_939);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"2",&local_9e9);
  FIX::ApplVerID::ApplVerID(&local_9c8,&local_9e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a10,"../spec/FIX40.xml",&local_a11);
  FIX::DataDictionaryProvider::addApplicationDataDictionary
            ((DataDictionaryProvider *)local_7e0,&local_9c8,&local_a10);
  std::__cxx11::string::~string((string *)&local_a10);
  std::allocator<char>::~allocator(&local_a11);
  FIX::ApplVerID::~ApplVerID(&local_9c8);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::allocator<char>::~allocator(&local_9e9);
  pSVar2 = (Session *)operator_new(0x848);
  FIX::Session::Session
            (pSVar2,&(this->super_TestCallback).super_NullApplication.super_Application,
             (MessageStoreFactory *)&this->factory,(SessionID *)local_188,
             (DataDictionaryProvider *)local_7e0,(TimeRange *)&provider.field_0x440,heartBtInt,
             (LogFactory *)0x0);
  this->object = pSVar2;
  pSVar2 = this->object;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_af8,"FIX.5.0",&local_af9);
  FIX::BeginString::BeginString(&local_ad8,&local_af8);
  FIX::Message::toApplVerID((ApplVerID *)&local_a78,&local_ad8);
  psVar1 = FIX::StringField::operator_cast_to_string_(&local_a78);
  FIX::Session::setSenderDefaultApplVerID(pSVar2,psVar1);
  FIX::ApplVerID::~ApplVerID((ApplVerID *)&local_a78);
  FIX::BeginString::~BeginString(&local_ad8);
  std::__cxx11::string::~string((string *)&local_af8);
  std::allocator<char>::~allocator(&local_af9);
  FIX::Session::setResponder(this->object,(Responder *)this);
  FIX::DataDictionaryProvider::~DataDictionaryProvider((DataDictionaryProvider *)local_7e0);
  FIX::TimeRange::~TimeRange((TimeRange *)&provider.field_0x440);
  FIX::SessionID::~SessionID((SessionID *)local_188);
  return;
}

Assistant:

virtual void createSession( int heartBtInt, int startDay = -1 , int endDay = -1 )
  {
    if( object )
      delete object;

    SessionID sessionID( BeginString( "FIXT.1.1" ),
                         SenderCompID( "TW" ), TargetCompID( "ISLD" ) );
    TimeRange sessionTime( startTime, endTime, startDay, endDay );

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIXT11.xml" );
    provider.addApplicationDataDictionary( ApplVerID(ApplVerID_FIX50), "../spec/FIX50.xml" );
    provider.addApplicationDataDictionary( ApplVerID(ApplVerID_FIX42), "../spec/FIX42.xml" );
    provider.addApplicationDataDictionary( ApplVerID(ApplVerID_FIX40), "../spec/FIX40.xml" );

    object = new Session( *this, factory, sessionID, provider,
                           sessionTime, heartBtInt, 0 );
    object->setSenderDefaultApplVerID( FIX::Message::toApplVerID(BeginString("FIX.5.0")) );
    object->setResponder( this );
  }